

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha.c
# Opt level: O2

int chacha_test_multiblock(chacha_key *key,chacha_iv *iv,uint8_t *in,uint8_t *out)

{
  int iVar1;
  size_t sVar2;
  size_t srclen;
  uint8_t final [64];
  chacha_state local_a8;
  
  memset(out,0,0x800);
  local_a8.opaque._0_8_ = *(undefined8 *)key->b;
  local_a8.opaque._8_8_ = *(undefined8 *)(key->b + 8);
  local_a8.opaque._16_8_ = *(undefined8 *)(key->b + 0x10);
  local_a8.opaque._24_8_ = *(undefined8 *)(key->b + 0x18);
  local_a8.opaque[0x20] = 0xff;
  local_a8.opaque[0x21] = 0xff;
  local_a8.opaque[0x22] = 0xff;
  local_a8.opaque[0x23] = 0xff;
  local_a8.opaque[0x24] = '\0';
  local_a8.opaque[0x25] = '\0';
  local_a8.opaque[0x26] = '\0';
  local_a8.opaque[0x27] = '\0';
  local_a8.opaque._40_8_ = *(undefined8 *)iv->b;
  local_a8.opaque[0x30] = '\b';
  local_a8.opaque[0x31] = '\0';
  local_a8.opaque[0x32] = '\0';
  local_a8.opaque[0x33] = '\0';
  local_a8.opaque[0x34] = '\0';
  local_a8.opaque[0x35] = '\0';
  local_a8.opaque[0x36] = '\0';
  local_a8.opaque[0x37] = '\0';
  local_a8.opaque[0x38] = '\0';
  local_a8.opaque[0x39] = '\0';
  local_a8.opaque[0x3a] = '\0';
  local_a8.opaque[0x3b] = '\0';
  local_a8.opaque[0x3c] = '\0';
  local_a8.opaque[0x3d] = '\0';
  local_a8.opaque[0x3e] = '\0';
  local_a8.opaque[0x3f] = '\0';
  sVar2 = chacha_update(&local_a8,in,out,0x800);
  chacha_final(&local_a8,out + sVar2);
  chacha_test_compact_array(final,out,srclen);
  iVar1 = bcmp(expected_chacha,final,0x40);
  return (int)(iVar1 == 0);
}

Assistant:

static int
chacha_test_multiblock(chacha_key *key, chacha_iv *iv, const uint8_t *in, uint8_t *out) {
    chacha_state st;
    uint8_t final[CHACHA_BLOCKBYTES];
    uint8_t *p = out;

    memset(out, 0, CHACHA_TEST_LEN);
    chacha_test_init_state(&st, key, iv);
    p += chacha_update(&st, in, p, CHACHA_TEST_LEN);
    chacha_final(&st, p);
    chacha_test_compact_array(final, out, CHACHA_TEST_LEN);
    return (memcmp(expected_chacha, final, sizeof(expected_chacha)) == 0) ? 1 : 0;
}